

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::Diagnostic,_2UL>::SmallVector
          (SmallVector<slang::Diagnostic,_2UL> *this,Base *other)

{
  bool bVar1;
  iterator pDVar2;
  Diagnostic *pDVar3;
  unsigned_long uVar4;
  int local_48 [2];
  void *local_40;
  move_iterator<slang::Diagnostic_*> local_38 [3];
  move_iterator<slang::Diagnostic_*> local_20;
  SmallVectorBase<slang::Diagnostic> *local_18;
  Base *other_local;
  SmallVector<slang::Diagnostic,_2UL> *this_local;
  
  local_18 = other;
  other_local = &this->super_SmallVectorBase<slang::Diagnostic>;
  SmallVectorBase<slang::Diagnostic>::SmallVectorBase
            (&this->super_SmallVectorBase<slang::Diagnostic>);
  bVar1 = SmallVectorBase<slang::Diagnostic>::isSmall(local_18);
  if (bVar1) {
    (this->super_SmallVectorBase<slang::Diagnostic>).cap = 2;
    pDVar2 = SmallVectorBase<slang::Diagnostic>::begin(local_18);
    std::move_iterator<slang::Diagnostic_*>::move_iterator(&local_20,pDVar2);
    pDVar2 = SmallVectorBase<slang::Diagnostic>::end(local_18);
    std::move_iterator<slang::Diagnostic_*>::move_iterator(local_38,pDVar2);
    SmallVectorBase<slang::Diagnostic>::append<std::move_iterator<slang::Diagnostic*>,void>
              (&this->super_SmallVectorBase<slang::Diagnostic>,local_20,local_38[0]);
  }
  else {
    local_40 = (void *)0x0;
    pDVar3 = std::exchange<slang::Diagnostic*,decltype(nullptr)>(&local_18->data_,&local_40);
    (this->super_SmallVectorBase<slang::Diagnostic>).data_ = pDVar3;
    local_48[1] = 0;
    uVar4 = std::exchange<unsigned_long,int>(&local_18->len,local_48 + 1);
    (this->super_SmallVectorBase<slang::Diagnostic>).len = uVar4;
    local_48[0] = 0;
    uVar4 = std::exchange<unsigned_long,int>(&local_18->cap,local_48);
    (this->super_SmallVectorBase<slang::Diagnostic>).cap = uVar4;
  }
  return;
}

Assistant:

SmallVector(Base&& other) {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::move_iterator(other.begin()), std::move_iterator(other.end()));
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }